

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall
CProficiencies::TrainProficiency
          (CProficiencies *this,char_data *ch,char_data *trainer,char *argument)

{
  CHAR_DATA *__return_storage_ptr__;
  string_view fmt;
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  const_reference __src;
  CProficiencies *pCVar5;
  PATHFIND_DATA *this_00;
  string *from;
  string *funcName;
  CHAR_DATA *in_RDX;
  char_data *in_RSI;
  code *args_2;
  string message;
  string buffer;
  proficiency_msg messages;
  short prof_requires;
  value_type proficiency;
  size_t profs_taught_size;
  bool found;
  int i;
  short prof;
  char arg1 [4608];
  char *in_stack_ffffffffffffeab8;
  char *in_stack_ffffffffffffeac0;
  CHAR_DATA *in_stack_ffffffffffffeac8;
  CHAR_DATA *in_stack_ffffffffffffead0;
  CHAR_DATA *in_stack_ffffffffffffead8;
  undefined4 in_stack_ffffffffffffeae0;
  int in_stack_ffffffffffffeae4;
  size_t in_stack_ffffffffffffeae8;
  allocator<char> *in_stack_ffffffffffffeaf0;
  allocator<char> *in_stack_ffffffffffffeaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb00;
  undefined4 local_14bc;
  undefined8 local_14b8;
  allocator<char> local_14a9;
  string local_14a8 [39];
  allocator<char> local_1481;
  string local_1480 [39];
  allocator<char> local_1459;
  string local_1458 [39];
  undefined1 local_1431 [56];
  allocator<char> local_13f9;
  string local_13f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec18;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
  *in_stack_ffffffffffffec20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec48;
  char_data **in_stack_ffffffffffffec50;
  string *in_stack_ffffffffffffec58;
  string *in_stack_ffffffffffffec60;
  int in_stack_ffffffffffffec6c;
  CQueue *in_stack_ffffffffffffec70;
  char_data **in_stack_ffffffffffffec80;
  void **in_stack_ffffffffffffec88;
  undefined6 in_stack_ffffffffffffec90;
  int *in_stack_ffffffffffffec98;
  int local_1358;
  int local_1354;
  size_t local_1340;
  byte local_1331;
  int local_1330;
  short local_132a;
  format_args in_stack_ffffffffffffed20;
  string_view in_stack_ffffffffffffed30;
  undefined1 local_110 [80];
  char *local_c0;
  CHAR_DATA *local_b8;
  PATHFIND_DATA *local_a8;
  char **local_a0;
  MOB_INDEX_DATA *local_98;
  DESCRIPTOR_DATA *local_90;
  undefined1 local_88 [24];
  OBJ_DATA *local_70;
  ROOM_INDEX_DATA *local_68;
  char *local_60;
  ROOM_INDEX_DATA *local_58;
  PC_DATA *local_50;
  PATHFIND_DATA *pPStack_40;
  CHAR_DATA *local_38;
  char **local_30;
  CHAR_DATA *local_28;
  CHAR_DATA *local_20;
  long local_18;
  char **local_10;
  OBJ_DATA *local_8;
  
  if (in_RSI == (char_data *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffead0,
               (char *)in_stack_ffffffffffffeac8);
    fmt._M_str = (char *)in_stack_ffffffffffffeaf0;
    fmt._M_len = in_stack_ffffffffffffeae8;
    CLogger::Debug<>((CLogger *)CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),fmt);
  }
  else if (in_RDX == (CHAR_DATA *)0x0) {
    send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  }
  else {
    local_110._0_8_ = in_RDX;
    local_110._8_8_ = in_RSI;
    one_argument(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
    bVar1 = str_cmp(&stack0xffffffffffffecd8,"train");
    if (bVar1) {
      send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
    }
    else {
      local_132a = ProfIndexLookup((char *)in_stack_ffffffffffffeac8);
      local_1331 = 0;
      local_1340 = std::size<short,4ul>
                             (&(*(MOB_INDEX_DATA **)(local_110._0_8_ + 0x78))->profs_taught);
      for (local_1330 = 0; (ulong)(long)local_1330 < local_1340; local_1330 = local_1330 + 1) {
        if ((*(MOB_INDEX_DATA **)(local_110._0_8_ + 0x78))->profs_taught[local_1330] == local_132a)
        {
          local_1331 = 1;
          break;
        }
      }
      if ((local_1331 & 1) == 0) {
        send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
      }
      else {
        char_data::Profs((char_data *)local_110._8_8_);
        iVar3 = GetProf((CProficiencies *)in_stack_ffffffffffffead8,
                        (int)((ulong)in_stack_ffffffffffffead0 >> 0x20));
        if (iVar3 < 1) {
          __src = std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                            (&prof_table,(long)local_132a);
          memcpy(&stack0xffffffffffffec98,__src,0x28);
          iVar3 = local_1358;
          pCVar5 = char_data::Profs((char_data *)local_110._8_8_);
          iVar4 = GetPoints(pCVar5);
          if (iVar4 < iVar3) {
            send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
          }
          else {
            sVar2 = ProfIndexLookup((char *)in_stack_ffffffffffffeac8);
            if (sVar2 != -1) {
              char_data::Profs((char_data *)local_110._8_8_);
              iVar3 = GetProf((CProficiencies *)in_stack_ffffffffffffead8,
                              (int)((ulong)in_stack_ffffffffffffead0 >> 0x20));
              if (iVar3 < 0) {
                send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
                return;
              }
            }
            if (*(short *)(local_110._8_8_ + 0x138) < local_1354) {
              send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
            }
            else {
              args_2 = (code *)0x3;
              act((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,
                  in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,0);
              memcpy(&stack0xffffffffffffec68,prof_msg_table + local_132a,0x28);
              for (local_1330 = 0;
                  *(long *)(&stack0xffffffffffffec68 + (long)local_1330 * 8) != 0 && local_1330 < 5;
                  local_1330 = local_1330 + 1) {
                if ((local_1330 == 4) ||
                   (*(long *)(&stack0xffffffffffffec68 + (long)(local_1330 + 1) * 8) == 0)) {
                  local_68 = (ROOM_INDEX_DATA *)&stack0xffffffffffffec38;
                  local_70 = (OBJ_DATA *)0x835013;
                  local_60 = "{}You are now proficient at {}.{}\n\r";
                  iVar3 = 0;
                  local_58 = local_68;
                  this_00 = (PATHFIND_DATA *)std::char_traits<char>::length((char_type *)0x7aa899);
                  local_8 = local_70;
                  from = (string *)
                         get_char_color(in_stack_ffffffffffffead8,(char *)in_stack_ffffffffffffead0)
                  ;
                  funcName = (string *)END_COLOR(in_stack_ffffffffffffeac8);
                  local_88._16_8_ = &stack0xffffffffffffec48;
                  local_90 = (DESCRIPTOR_DATA *)&stack0xffffffffffffec30;
                  local_a0 = (char **)&stack0xffffffffffffec28;
                  local_50 = (PC_DATA *)local_88;
                  __return_storage_ptr__ = (CHAR_DATA *)(local_110 + 0x18);
                  local_a8 = this_00;
                  local_98 = (MOB_INDEX_DATA *)&stack0xffffffffffffeca0;
                  pPStack_40 = this_00;
                  ::fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char*&,char*&>
                            ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*,_char_*>
                              *)__return_storage_ptr__,(v9 *)local_90,
                             (char **)&stack0xffffffffffffeca0,local_a0,(char **)args_2);
                  local_30 = &local_c0;
                  local_18 = 0xccc;
                  local_c0 = (char *)0xccc;
                  local_38 = __return_storage_ptr__;
                  local_28 = __return_storage_ptr__;
                  local_20 = __return_storage_ptr__;
                  local_10 = local_30;
                  local_b8 = __return_storage_ptr__;
                  ::fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffed30,in_stack_ffffffffffffed20)
                  ;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                             in_stack_ffffffffffffeaf0);
                  in_stack_ffffffffffffeb00 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1431;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                             in_stack_ffffffffffffeaf0);
                  CQueue::
                  AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
                            ((CQueue *)this_00,iVar3,from,funcName,in_stack_ffffffffffffec20,
                             in_stack_ffffffffffffec18,in_stack_ffffffffffffec50);
                  std::__cxx11::string::~string((string *)(local_1431 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_1431);
                  std::__cxx11::string::~string(local_13f8);
                  std::allocator<char>::~allocator(&local_13f9);
                  std::__cxx11::string::~string((string *)&stack0xffffffffffffec48);
                }
                in_stack_ffffffffffffeaf0 =
                     (allocator<char> *)prof_msg_table[local_132a].learning_msgs[local_1330];
                in_stack_ffffffffffffeaf8 = &local_1459;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                           in_stack_ffffffffffffeaf0);
                std::allocator<char>::~allocator(&local_1459);
                in_stack_ffffffffffffeae4 = local_1330 * 2 + 2;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                           in_stack_ffffffffffffeaf0);
                in_stack_ffffffffffffead8 = (CHAR_DATA *)&local_14a9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                           in_stack_ffffffffffffeaf0);
                local_14b8 = 0;
                local_14bc = 3;
                in_stack_ffffffffffffead0 = (CHAR_DATA *)&local_14bc;
                in_stack_ffffffffffffeac8 = (CHAR_DATA *)local_110;
                args_2 = act_queue;
                CQueue::
                AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),std::__cxx11::string&,char_data*&,decltype(nullptr),char_data*&,int>
                          (in_stack_ffffffffffffec70,in_stack_ffffffffffffec6c,
                           in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,
                           (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                            *)in_stack_ffffffffffffec50,in_stack_ffffffffffffec48,
                           in_stack_ffffffffffffec80,in_stack_ffffffffffffec88,
                           (char_data **)CONCAT26(sVar2,in_stack_ffffffffffffec90),
                           in_stack_ffffffffffffec98);
                std::__cxx11::string::~string(local_14a8);
                std::allocator<char>::~allocator(&local_14a9);
                std::__cxx11::string::~string(local_1480);
                std::allocator<char>::~allocator(&local_1481);
                std::__cxx11::string::~string(local_1458);
              }
              pCVar5 = char_data::Profs((char_data *)local_110._8_8_);
              iVar3 = (int)((ulong)in_stack_ffffffffffffeac8 >> 0x20);
              DeductPoints(pCVar5,local_1358);
              char_data::Profs((char_data *)local_110._8_8_);
              SetProf((CProficiencies *)
                      CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),
                      (int)((ulong)in_stack_ffffffffffffead8 >> 0x20),(int)in_stack_ffffffffffffead8
                     );
              WAIT_STATE(in_stack_ffffffffffffead0,iVar3);
            }
          }
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
        }
      }
    }
  }
  return;
}

Assistant:

void CProficiencies::TrainProficiency(char_data* ch, char_data* trainer, char* argument)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("CProficiencies::TrainProficiency: Charater is null.");
		return;
	}
	
	if (trainer == nullptr)
	{
		send_to_char("Invalid trainer", ch);
		return;
	}

	char arg1[MSL];
	argument = one_argument(argument, arg1);

	if (str_cmp(arg1, "train"))
	{
		send_to_char("Syntax: proficiencies train <proficiency>\n\r", ch);
		return;
	}

	auto prof = ProfIndexLookup(argument);

	int i;
	auto found = false;
	auto profs_taught_size = std::size(trainer->pIndexData->profs_taught);
	for (i = 0; i < profs_taught_size; i++)
	{
		if (trainer->pIndexData->profs_taught[i] == prof)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		send_to_char("You can't study that here.\n\r", ch);
		return;
	}

	if (ch->Profs()->GetProf(prof) > 0)
	{
		send_to_char("You are already familiar with that proficiency.\n\r", ch);
		return;
	}

	auto proficiency = prof_table[prof];
	if (proficiency.cost > ch->Profs()->GetPoints())
	{
		send_to_char("You don't have enough points to study that proficiency.\n\r", ch);
		return;
	}

	auto prof_requires = ProfIndexLookup(proficiency.requires);
	if (prof_requires != -1 && ch->Profs()->GetProf(prof_requires) < 0)
	{
		send_to_char("That proficiency requires understanding of a proficiency you do not possess.\n\r", ch);
		return;
	}

	if (proficiency.minlevel > ch->level)
	{
		send_to_char("You are not advanced enough in your guild to learn that proficiency.\n\r", ch);
		return;
	}

	act("You ask $N to teach you about $t.", ch, proficiency.name, trainer, TO_CHAR);

	auto messages = prof_msg_table[prof];
	for (i = 0; messages.learning_msgs[i] != nullptr && i < 5; i++)
	{
		if (i == 4 || !messages.learning_msgs[i + 1])
		{
			auto buffer = fmt::format("{}You are now proficient at {}.{}\n\r",
				get_char_color(ch, "yellow"),
				proficiency.name,
				END_COLOR(ch));

			RS.Queue.AddToQueue((i + 1) * 2, "TrainProficiency", "send_to_char_queue", send_to_char_queue, buffer, ch);
		}

		auto message = std::string(prof_msg_table[prof].learning_msgs[i]);
		RS.Queue.AddToQueue((i + 1) * 2, "TrainProficiency", "act_queue", act_queue, message, ch, nullptr, trainer, TO_CHAR);
	}

	ch->Profs()->DeductPoints(proficiency.cost);
	ch->Profs()->SetProf(prof, 1);

	WAIT_STATE(ch, (i + 1) * 2);
}